

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

bool units::segmentcheck(string *unit,char closeSegment,size_t *index)

{
  byte mchar;
  ulong uVar1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  byte unaff_R15B;
  
  do {
    uVar1 = *index;
    if (unit->_M_string_length <= uVar1) {
      unaff_R15B = 0;
      break;
    }
    mchar = (unit->_M_dataplus)._M_p[uVar1];
    *index = uVar1 + 1;
    if (mchar == closeSegment) {
      unaff_R15B = 1;
LAB_0041536a:
      bVar4 = false;
      bVar2 = unaff_R15B;
    }
    else {
      bVar4 = false;
      if (mchar < 0x5c) {
        if (mchar < 0x29) {
          if ((mchar == 0x22) || (mchar == 0x28)) {
            cVar3 = getMatchCharacter(mchar);
            bVar4 = segmentcheck(unit,cVar3,index);
            if (!bVar4) {
              bVar4 = false;
              bVar2 = 0;
              goto LAB_00415425;
            }
          }
        }
        else {
          bVar2 = 0;
          if (mchar == 0x29) goto LAB_00415425;
          if (mchar == 0x5b) goto LAB_004153e3;
        }
      }
      else if (mchar < 0x7b) {
        if (mchar == 0x5c) {
          *index = uVar1 + 2;
        }
        else {
          bVar2 = 0;
          if (mchar == 0x5d) goto LAB_00415425;
        }
      }
      else if (mchar == 0x7b) {
LAB_004153e3:
        cVar3 = getMatchCharacter(mchar);
        if (cVar3 == closeSegment) {
          bVar4 = false;
          unaff_R15B = 0;
        }
        else {
          bVar4 = segmentcheck(unit,cVar3,index);
          unaff_R15B = unaff_R15B & bVar4;
        }
        if (bVar4 == false) goto LAB_0041536a;
      }
      else {
        bVar2 = 0;
        if (mchar == 0x7d) goto LAB_00415425;
      }
      bVar4 = true;
      bVar2 = unaff_R15B;
    }
LAB_00415425:
    unaff_R15B = bVar2;
  } while (bVar4);
  return (bool)(unaff_R15B & 1);
}

Assistant:

static bool
    segmentcheck(const std::string& unit, char closeSegment, size_t& index)
{
    while (index < unit.size()) {
        char current = unit[index];
        ++index;
        if (current == closeSegment) {
            return true;
        }
        switch (current) {
            case '\\':
                ++index;
                break;
            case '(':
            case '"':
                if (!segmentcheck(unit, getMatchCharacter(current), index)) {
                    return false;
                }
                break;
            case '{':
            case '[': {
                auto close = getMatchCharacter(current);
                if (close == closeSegment) {
                    return false;
                }
                if (!segmentcheck(unit, close, index)) {
                    return false;
                }
                break;
            }
            case '}':
            case ')':
            case ']':
                return false;
            default:
                break;
        }
    }
    return false;
}